

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.h
# Opt level: O2

void __thiscall icu_63::UVector32::addElement(UVector32 *this,int32_t elem,UErrorCode *status)

{
  UBool UVar1;
  
  UVar1 = ensureCapacity(this,this->count + 1,status);
  if (UVar1 != '\0') {
    this->elements[this->count] = elem;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

inline void UVector32::addElement(int32_t elem, UErrorCode &status) {
    if (ensureCapacity(count + 1, status)) {
        elements[count] = elem;
        count++;
    }
}